

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_getFrameHeader_advanced
                 (ZSTD_frameHeader *zfhPtr,void *src,size_t srcSize,ZSTD_format_e format)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uStack_30;
  
  lVar1 = (ulong)(format != ZSTD_f_zstd1_magicless) * 4;
  uVar6 = lVar1 + 1;
  zfhPtr->blockSizeMax = 0;
  zfhPtr->frameType = ZSTD_frame;
  zfhPtr->headerSize = 0;
  zfhPtr->dictID = 0;
  zfhPtr->frameContentSize = 0;
  zfhPtr->windowSize = 0;
  *(undefined8 *)&zfhPtr->checksumFlag = 0;
  uStack_30 = uVar6;
  if (uVar6 <= srcSize) {
    if (src == (void *)0x0) {
      uStack_30 = 0xffffffffffffffff;
    }
    else if ((format == ZSTD_f_zstd1_magicless) || (*src == 0xfd2fb528)) {
      uStack_30 = ZSTD_frameHeaderSize_internal(src,srcSize,format);
      if (uStack_30 <= srcSize) {
        zfhPtr->headerSize = (uint)uStack_30;
        bVar2 = *(byte *)((long)src + lVar1);
        if ((bVar2 & 8) == 0) {
          if ((bVar2 & 0x20) == 0) {
            if (0xaf < *(byte *)((long)src + uVar6)) {
              return 0xfffffffffffffff0;
            }
            uVar6 = lVar1 + 2;
          }
          bVar4 = bVar2 >> 2 & 1;
          uVar5 = (ulong)(bVar2 >> 6);
          switch(bVar2 & 3) {
          case 0:
            sVar3 = (*(code *)(&DAT_00144ec0 + *(int *)(&DAT_00144ec0 + uVar5 * 4)))();
            return sVar3;
          case 1:
            sVar3 = (*(code *)(&DAT_00144ec0 + *(int *)(&DAT_00144ec0 + uVar5 * 4)))
                              (&DAT_00144ec0,*(undefined1 *)((long)src + uVar6),bVar2,bVar4,
                               &DAT_00144ec0 + *(int *)(&DAT_00144ec0 + uVar5 * 4));
            return sVar3;
          case 2:
            sVar3 = (*(code *)(&DAT_00144ec0 + *(int *)(&DAT_00144ec0 + uVar5 * 4)))
                              (&DAT_00144ec0,*(undefined2 *)((long)src + uVar6),bVar2,bVar4,
                               &DAT_00144ec0 + *(int *)(&DAT_00144ec0 + uVar5 * 4));
            return sVar3;
          case 3:
            sVar3 = (*(code *)(&DAT_00144ec0 + *(int *)(&DAT_00144ec0 + uVar5 * 4)))
                              (&DAT_00144ec0,*(undefined4 *)((long)src + uVar6),bVar2,bVar4,
                               &DAT_00144ec0 + *(int *)(&DAT_00144ec0 + uVar5 * 4));
            return sVar3;
          }
        }
        uStack_30 = 0xfffffffffffffff2;
      }
    }
    else if ((*src & 0xfffffff0) == 0x184d2a50) {
      if (srcSize < 8) {
        uStack_30 = 8;
      }
      else {
        zfhPtr->frameContentSize = (ulong)*(uint *)((long)src + 4);
        zfhPtr->frameType = ZSTD_skippableFrame;
        uStack_30 = 0;
      }
    }
    else {
      uStack_30 = 0xfffffffffffffff6;
    }
  }
  return uStack_30;
}

Assistant:

size_t ZSTD_getFrameHeader_advanced(ZSTD_frameHeader* zfhPtr, const void* src, size_t srcSize, ZSTD_format_e format)
{
    const BYTE* ip = (const BYTE*)src;
    size_t const minInputSize = ZSTD_startingInputLength(format);

    memset(zfhPtr, 0, sizeof(*zfhPtr));   /* not strictly necessary, but static analyzer do not understand that zfhPtr is only going to be read only if return value is zero, since they are 2 different signals */
    if (srcSize < minInputSize) return minInputSize;
    RETURN_ERROR_IF(src==NULL, GENERIC, "invalid parameter");

    if ( (format != ZSTD_f_zstd1_magicless)
      && (MEM_readLE32(src) != ZSTD_MAGICNUMBER) ) {
        if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            /* skippable frame */
            if (srcSize < ZSTD_SKIPPABLEHEADERSIZE)
                return ZSTD_SKIPPABLEHEADERSIZE; /* magic number + frame length */
            memset(zfhPtr, 0, sizeof(*zfhPtr));
            zfhPtr->frameContentSize = MEM_readLE32((const char *)src + ZSTD_FRAMEIDSIZE);
            zfhPtr->frameType = ZSTD_skippableFrame;
            return 0;
        }
        RETURN_ERROR(prefix_unknown);
    }

    /* ensure there is enough `srcSize` to fully read/decode frame header */
    {   size_t const fhsize = ZSTD_frameHeaderSize_internal(src, srcSize, format);
        if (srcSize < fhsize) return fhsize;
        zfhPtr->headerSize = (U32)fhsize;
    }

    {   BYTE const fhdByte = ip[minInputSize-1];
        size_t pos = minInputSize;
        U32 const dictIDSizeCode = fhdByte&3;
        U32 const checksumFlag = (fhdByte>>2)&1;
        U32 const singleSegment = (fhdByte>>5)&1;
        U32 const fcsID = fhdByte>>6;
        U64 windowSize = 0;
        U32 dictID = 0;
        U64 frameContentSize = ZSTD_CONTENTSIZE_UNKNOWN;
        RETURN_ERROR_IF((fhdByte & 0x08) != 0, frameParameter_unsupported,
                        "reserved bits, must be zero");

        if (!singleSegment) {
            BYTE const wlByte = ip[pos++];
            U32 const windowLog = (wlByte >> 3) + ZSTD_WINDOWLOG_ABSOLUTEMIN;
            RETURN_ERROR_IF(windowLog > ZSTD_WINDOWLOG_MAX, frameParameter_windowTooLarge);
            windowSize = (1ULL << windowLog);
            windowSize += (windowSize >> 3) * (wlByte&7);
        }
        switch(dictIDSizeCode)
        {
            default: assert(0);  /* impossible */
            case 0 : break;
            case 1 : dictID = ip[pos]; pos++; break;
            case 2 : dictID = MEM_readLE16(ip+pos); pos+=2; break;
            case 3 : dictID = MEM_readLE32(ip+pos); pos+=4; break;
        }
        switch(fcsID)
        {
            default: assert(0);  /* impossible */
            case 0 : if (singleSegment) frameContentSize = ip[pos]; break;
            case 1 : frameContentSize = MEM_readLE16(ip+pos)+256; break;
            case 2 : frameContentSize = MEM_readLE32(ip+pos); break;
            case 3 : frameContentSize = MEM_readLE64(ip+pos); break;
        }
        if (singleSegment) windowSize = frameContentSize;

        zfhPtr->frameType = ZSTD_frame;
        zfhPtr->frameContentSize = frameContentSize;
        zfhPtr->windowSize = windowSize;
        zfhPtr->blockSizeMax = (unsigned) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
        zfhPtr->dictID = dictID;
        zfhPtr->checksumFlag = checksumFlag;
    }
    return 0;
}